

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemcontext.h
# Opt level: O1

void __thiscall
cookmem::MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::~MemContext
          (MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this)

{
  MemSegment *pMVar1;
  MemSegment *__addr;
  
  this->_vptr_MemContext = (_func_int **)&PTR__MemContext_00105d98;
  __addr = (this->m_pool).m_segList;
  while (__addr != (MemSegment *)0x0) {
    pMVar1 = __addr->m_next;
    munmap(__addr,__addr->m_size);
    __addr = pMVar1;
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~MemContext()
    {
    }